

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryBone(AssbinExport *this,IOStream *container,aiBone *b)

{
  uint uVar1;
  uint i;
  uint32_t t;
  uint32_t t_1;
  AssbinChunkWriter chunk;
  uint local_a8 [6];
  AssbinChunkWriter local_90;
  aiBone *local_58;
  AssbinExport *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  local_90.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0082be60;
  local_90.buffer = (uint8_t *)0x0;
  local_90.magic = 0x123a;
  local_90.cur_size = 0;
  local_90.cursor = 0;
  local_90.initial = 0x1000;
  uVar1 = (b->mName).length;
  local_90.container = container;
  local_50 = this;
  AssbinChunkWriter::Grow(&local_90,4);
  *(ai_uint32 *)(local_90.buffer + local_90.cursor) = (b->mName).length;
  local_90.cursor = local_90.cursor + 4;
  (*local_90.super_IOStream._vptr_IOStream[3])(&local_90,(b->mName).data,(ulong)uVar1,1);
  local_a8[0] = b->mNumWeights;
  (*local_90.super_IOStream._vptr_IOStream[3])(&local_90,local_a8,4,1);
  local_38 = &(b->mOffsetMatrix).d1;
  local_40 = &(b->mOffsetMatrix).c1;
  local_48 = &(b->mOffsetMatrix).b1;
  local_58 = b;
  (*local_90.super_IOStream._vptr_IOStream[3])(&local_90,&b->mOffsetMatrix,4,1);
  (*(code *)&LAB_00313537)();
  return;
}

Assistant:

void WriteBinaryBone(IOStream * container, const aiBone* b)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIBONE );

        Write<aiString>(&chunk,b->mName);
        Write<unsigned int>(&chunk,b->mNumWeights);
        Write<aiMatrix4x4>(&chunk,b->mOffsetMatrix);

        // for the moment we write dumb min/max values for the bones, too.
        // maybe I'll add a better, hash-like solution later
        if (shortened) {
            WriteBounds(&chunk,b->mWeights,b->mNumWeights);
        } // else write as usual
        else WriteArray<aiVertexWeight>(&chunk,b->mWeights,b->mNumWeights);
    }